

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afcjk.c
# Opt level: O2

void af_cjk_hints_compute_blue_edges(AF_GlyphHints hints,AF_CJKMetrics metrics,AF_Dimension dim)

{
  int iVar1;
  long lVar2;
  int iVar3;
  AF_Edge_conflict pAVar4;
  AF_Width pAVar5;
  ulong uVar6;
  AF_Width pAVar7;
  AF_Edge_conflict pAVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  AF_Width pAVar14;
  ulong uVar15;
  FT_Pos best_dist;
  bool bVar16;
  
  pAVar8 = hints->axis[dim].edges;
  pAVar4 = pAVar8 + hints->axis[dim].num_edges;
  lVar12 = (long)(int)metrics->axis[dim].scale;
  lVar2 = ((ulong)metrics->units_per_em / 0x28) * lVar12;
  iVar1 = (int)((ulong)(lVar2 + (lVar2 >> 0x3f) + 0x8000) >> 0x10);
  iVar3 = 0x20;
  if (iVar1 < 0x20) {
    iVar3 = iVar1;
  }
  for (; pAVar8 < pAVar4; pAVar8 = pAVar8 + 1) {
    uVar13 = (ulong)metrics->axis[dim].blue_count;
    pAVar7 = (AF_Width)0x0;
    pAVar5 = &metrics->axis[dim].blues[0].ref;
    iVar1 = iVar3;
    while (bVar16 = uVar13 != 0, uVar13 = uVar13 - 1, bVar16) {
      if (((*(uint *)&pAVar5[2].org & 1) != 0) &&
         (((*(uint *)&pAVar5[2].org & 2) == 0) == (hints->axis[dim].major_dir == (int)pAVar8->dir)))
      {
        lVar10 = (long)pAVar8->fpos;
        lVar2 = ((AF_WidthRec *)&pAVar5->org)->org;
        uVar15 = lVar10 - lVar2;
        uVar6 = -uVar15;
        if (0 < (long)uVar15) {
          uVar6 = uVar15;
        }
        uVar11 = lVar10 - pAVar5[1].org;
        uVar15 = -uVar11;
        if (0 < (long)uVar11) {
          uVar15 = uVar11;
        }
        pAVar14 = pAVar5;
        if (uVar15 < uVar6) {
          pAVar14 = pAVar5 + 1;
          lVar2 = pAVar5[1].org;
        }
        lVar10 = lVar10 - lVar2;
        lVar2 = -lVar10;
        if (0 < lVar10) {
          lVar2 = lVar10;
        }
        lVar2 = (int)lVar2 * lVar12;
        iVar9 = (int)((ulong)(lVar2 + (lVar2 >> 0x3f) + 0x8000) >> 0x10);
        if (iVar9 < iVar1) {
          pAVar7 = pAVar14;
        }
        if (iVar9 <= iVar1) {
          iVar1 = iVar9;
        }
      }
      pAVar5 = (AF_Width)&pAVar5[2].cur;
    }
    if (pAVar7 != (AF_Width)0x0) {
      pAVar8->blue_edge = pAVar7;
    }
  }
  return;
}

Assistant:

static void
  af_cjk_hints_compute_blue_edges( AF_GlyphHints  hints,
                                   AF_CJKMetrics  metrics,
                                   AF_Dimension   dim )
  {
    AF_AxisHints  axis       = &hints->axis[dim];
    AF_Edge       edge       = axis->edges;
    AF_Edge       edge_limit = edge + axis->num_edges;
    AF_CJKAxis    cjk        = &metrics->axis[dim];
    FT_Fixed      scale      = cjk->scale;
    FT_Pos        best_dist0;  /* initial threshold */


    /* compute the initial threshold as a fraction of the EM size */
    best_dist0 = FT_MulFix( metrics->units_per_em / 40, scale );

    if ( best_dist0 > 64 / 2 ) /* maximum 1/2 pixel */
      best_dist0 = 64 / 2;

    /* compute which blue zones are active, i.e. have their scaled */
    /* size < 3/4 pixels                                           */

    /* If the distant between an edge and a blue zone is shorter than */
    /* best_dist0, set the blue zone for the edge.  Then search for   */
    /* the blue zone with the smallest best_dist to the edge.         */

    for ( ; edge < edge_limit; edge++ )
    {
      FT_UInt   bb;
      AF_Width  best_blue = NULL;
      FT_Pos    best_dist = best_dist0;


      for ( bb = 0; bb < cjk->blue_count; bb++ )
      {
        AF_CJKBlue  blue = cjk->blues + bb;
        FT_Bool     is_top_right_blue, is_major_dir;


        /* skip inactive blue zones (i.e., those that are too small) */
        if ( !( blue->flags & AF_CJK_BLUE_ACTIVE ) )
          continue;

        /* if it is a top zone, check for right edges -- if it is a bottom */
        /* zone, check for left edges                                      */
        /*                                                                 */
        /* of course, that's for TrueType                                  */
        is_top_right_blue =
          (FT_Byte)( ( blue->flags & AF_CJK_BLUE_TOP ) != 0 );
        is_major_dir =
          FT_BOOL( edge->dir == axis->major_dir );

        /* if it is a top zone, the edge must be against the major    */
        /* direction; if it is a bottom zone, it must be in the major */
        /* direction                                                  */
        if ( is_top_right_blue ^ is_major_dir )
        {
          FT_Pos    dist;
          AF_Width  compare;


          /* Compare the edge to the closest blue zone type */
          if ( FT_ABS( edge->fpos - blue->ref.org ) >
               FT_ABS( edge->fpos - blue->shoot.org ) )
            compare = &blue->shoot;
          else
            compare = &blue->ref;

          dist = edge->fpos - compare->org;
          if ( dist < 0 )
            dist = -dist;

          dist = FT_MulFix( dist, scale );
          if ( dist < best_dist )
          {
            best_dist = dist;
            best_blue = compare;
          }
        }
      }

      if ( best_blue )
        edge->blue_edge = best_blue;
    }
  }